

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O3

void __thiscall
cmDocumentationFormatter::PrintSection
          (cmDocumentationFormatter *this,ostream *os,cmDocumentationSection *section)

{
  size_t sVar1;
  pointer pcVar2;
  pointer pcVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  ulong uVar6;
  ostream *poVar7;
  ulong uVar8;
  cmDocumentationEntry *entry;
  pointer pcVar9;
  char local_59;
  long *local_58;
  long local_50;
  long local_48 [2];
  size_t local_38;
  
  sVar1 = this->TextIndent;
  pcVar2 = (section->Name)._M_dataplus._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (section->Name)._M_string_length);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  local_59 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_59,1);
  local_38 = sVar1;
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  pcVar9 = (section->Entries).
           super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (section->Entries).
           super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar9 != pcVar3) {
    do {
      if ((pcVar9->Name)._M_string_length == 0) {
        local_58 = (long *)CONCAT71(local_58._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_58,1);
        this->TextIndent = 0;
        PrintFormatted(this,os,&pcVar9->Brief);
      }
      else {
        this->TextIndent = 0x21;
        pp_Var4 = os->_vptr_basic_ostream;
        *(undefined8 *)(&os->field_0x10 + (long)pp_Var4[-3]) = 2;
        p_Var5 = pp_Var4[-3];
        *(uint *)(&os->field_0x18 + (long)p_Var5) =
             *(uint *)(&os->field_0x18 + (long)p_Var5) & 0xffffff4f | 0x20;
        local_58._0_1_ = (string)pcVar9->CustomNamePrefix;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_58,1);
        uVar6 = (pcVar9->Name)._M_string_length;
        uVar8 = 0x1d;
        if (0x1d < uVar6) {
          uVar8 = uVar6;
        }
        *(long *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = (long)(int)uVar8;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,(pcVar9->Name)._M_dataplus._M_p,uVar6);
        if (0x1d < (pcVar9->Name)._M_string_length) {
          local_58._0_1_ = (string)0xa;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_58,1);
          *(long *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) =
               (long)((int)this->TextIndent + -2);
          local_58._0_1_ = (string)0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_58,1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"= ",2);
        PrintColumn(this,os,&pcVar9->Brief);
        local_58 = (long *)CONCAT71(local_58._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_58,1);
      }
      pcVar9 = pcVar9 + 1;
    } while (pcVar9 != pcVar3);
  }
  local_58 = (long *)CONCAT71(local_58._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_58,1);
  this->TextIndent = local_38;
  return;
}

Assistant:

void cmDocumentationFormatter::PrintSection(
  std::ostream& os, cmDocumentationSection const& section)
{
  const std::size_t PREFIX_SIZE =
    sizeof(cmDocumentationEntry::CustomNamePrefix) + 1u;
  // length of the "= " literal (see below)
  const std::size_t SUFFIX_SIZE = 2u;
  // legacy magic number ;-)
  const std::size_t NAME_SIZE = 29u;

  const std::size_t PADDING_SIZE = PREFIX_SIZE + SUFFIX_SIZE;
  const std::size_t TITLE_SIZE = NAME_SIZE + PADDING_SIZE;

  const auto savedIndent = this->TextIndent;

  os << section.GetName() << '\n';

  for (cmDocumentationEntry const& entry : section.GetEntries()) {
    if (!entry.Name.empty()) {
      this->TextIndent = TITLE_SIZE;
      os << std::setw(PREFIX_SIZE) << std::left << entry.CustomNamePrefix
         << std::setw(int(std::max(NAME_SIZE, entry.Name.size())))
         << entry.Name;
      if (entry.Name.size() > NAME_SIZE) {
        os << '\n' << std::setw(int(this->TextIndent - PREFIX_SIZE)) << ' ';
      }
      os << "= ";
      this->PrintColumn(os, entry.Brief);
      os << '\n';
    } else {
      os << '\n';
      this->TextIndent = 0u;
      this->PrintFormatted(os, entry.Brief);
    }
  }

  os << '\n';

  this->TextIndent = savedIndent;
}